

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O3

void kill_use_list(dmr_C *C,pseudo_list *list)

{
  undefined1 *puVar1;
  undefined1 local_38 [8];
  ptr_list_iter piter__;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_38,(ptr_list *)list);
  puVar1 = (undefined1 *)ptrlist_iter_next((ptr_list_iter *)local_38);
  while (puVar1 != (undefined1 *)0x0) {
    if ((pseudo *)puVar1 != &C->L->void_pseudo) {
      dmrC_kill_use(C,(pseudo_t *)((piter__.__head)->list_ + (int)piter__.__list));
    }
    puVar1 = (undefined1 *)ptrlist_iter_next((ptr_list_iter *)local_38);
  }
  return;
}

Assistant:

static void kill_use_list(struct dmr_C *C, struct pseudo_list *list)
{
	pseudo_t p;
	FOR_EACH_PTR(list, p) {
		if (p == VOID_PSEUDO(C))
			continue;
		dmrC_kill_use(C, THIS_ADDRESS(pseudo_t, p));
	} END_FOR_EACH_PTR(p);
}